

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

SQObject __thiscall SQCompiler::ExpectScalar(SQCompiler *this)

{
  long lVar1;
  SQObjectType SVar2;
  SQInteger SVar3;
  char *s;
  SQObject SVar4;
  SQObjectValue local_18;
  
  local_18.pTable = (SQTable *)0x0;
  lVar1 = this->_token;
  if (lVar1 < 0x105) {
    if (lVar1 == 0x2d) {
      SVar3 = SQLexer::Lex(&this->_lex);
      this->_token = SVar3;
      if (SVar3 == 0x105) {
        local_18.fFloat = -(this->_lex)._fvalue;
        goto LAB_001198e7;
      }
      if (SVar3 != 0x104) {
        s = "scalar expected : integer, float";
        goto LAB_001198fa;
      }
      local_18.nInteger = -(this->_lex)._nvalue;
    }
    else {
      if (lVar1 == 0x103) {
        SVar4 = SQFuncState::CreateString
                          (this->_fs,(this->_lex)._svalue,(this->_lex)._longstr._size - 1);
        local_18 = SVar4._unVal;
        SVar2 = SVar4._type;
        goto LAB_00119909;
      }
      if (lVar1 != 0x104) goto LAB_001198b3;
      local_18 = (SQObjectValue)(this->_lex)._nvalue;
    }
    SVar2 = OT_INTEGER;
  }
  else {
    if (lVar1 - 0x13bU < 2) {
      local_18.nInteger._1_7_ = 0;
      local_18.nInteger._0_1_ = lVar1 == 0x13b;
      SVar2 = OT_BOOL;
      goto LAB_00119909;
    }
    if (lVar1 != 0x105) {
LAB_001198b3:
      s = "scalar expected : integer, float, or string";
LAB_001198fa:
      Error(this,s);
      SVar2 = OT_NULL;
      goto LAB_00119909;
    }
    local_18.fFloat = (this->_lex)._fvalue;
LAB_001198e7:
    local_18.nInteger._4_4_ = 0;
    SVar2 = OT_FLOAT;
  }
LAB_00119909:
  SVar3 = SQLexer::Lex(&this->_lex);
  this->_token = SVar3;
  SVar4._4_4_ = 0;
  SVar4._type = SVar2;
  SVar4._unVal.pTable = local_18.pTable;
  return SVar4;
}

Assistant:

SQObject ExpectScalar()
    {
        SQObject val;
        val._type = OT_NULL; val._unVal.nInteger = 0; //shut up GCC 4.x
        switch(_token) {
            case TK_INTEGER:
                val._type = OT_INTEGER;
                val._unVal.nInteger = _lex._nvalue;
                break;
            case TK_FLOAT:
                val._type = OT_FLOAT;
                val._unVal.fFloat = _lex._fvalue;
                break;
            case TK_STRING_LITERAL:
                val = _fs->CreateString(_lex._svalue,_lex._longstr.size()-1);
                break;
            case TK_TRUE:
            case TK_FALSE:
                val._type = OT_BOOL;
                val._unVal.nInteger = _token == TK_TRUE ? 1 : 0;
                break;
            case '-':
                Lex();
                switch(_token)
                {
                case TK_INTEGER:
                    val._type = OT_INTEGER;
                    val._unVal.nInteger = -_lex._nvalue;
                break;
                case TK_FLOAT:
                    val._type = OT_FLOAT;
                    val._unVal.fFloat = -_lex._fvalue;
                break;
                default:
                    Error(_SC("scalar expected : integer, float"));
                }
                break;
            default:
                Error(_SC("scalar expected : integer, float, or string"));
        }
        Lex();
        return val;
    }